

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int bitset_container_compute_cardinality(bitset_container_t *bitset)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  uint64_t in_RSI;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    uVar3 = avx2_harley_seal_popcount256((__m256i *)bitset->words,in_RSI);
    return (int)uVar3;
  }
  iVar2 = _scalar_bitset_container_compute_cardinality(bitset);
  return iVar2;
}

Assistant:

int bitset_container_compute_cardinality(const bitset_container_t *bitset) {
    if( croaring_avx2() ) {
      return (int) avx2_harley_seal_popcount256(
        (const __m256i *)bitset->words,
        BITSET_CONTAINER_SIZE_IN_WORDS / (WORDS_IN_AVX2_REG));
    } else {
      return _scalar_bitset_container_compute_cardinality(bitset);

    }
}